

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void google::protobuf::compiler::ruby::
     ForEachField<google::protobuf::compiler::ruby::DumpImportList[abi:cxx11](google::protobuf::FileDescriptor_const*)::__0>
               (FileDescriptor *file,anon_class_16_2_632c2391 *func)

{
  int iVar1;
  Descriptor *d;
  FieldDescriptor *field;
  undefined4 local_20;
  undefined4 local_1c;
  int i_1;
  int i;
  anon_class_16_2_632c2391 *func_local;
  FileDescriptor *file_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(file);
    if (iVar1 <= local_1c) break;
    d = FileDescriptor::message_type(file,local_1c);
    ForEachField<google::protobuf::compiler::ruby::DumpImportList[abi:cxx11](google::protobuf::FileDescriptor_const*)::__0&>
              (d,func);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = FileDescriptor::extension_count(file);
    if (iVar1 <= local_20) break;
    field = FileDescriptor::extension(file,local_20);
    DumpImportList::anon_class_16_2_632c2391::operator()(func,field);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void ForEachField(const FileDescriptor* file, F&& func) {
  for (int i = 0; i < file->message_type_count(); i++) {
    ForEachField(file->message_type(i), func);
  }
  for (int i = 0; i < file->extension_count(); i++) {
    func(file->extension(i));
  }
}